

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_1::IOBlock::IOBlock
          (IOBlock *this,string *blockName,string *interfaceName,
          vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
          *members)

{
  vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
  *members_local;
  string *interfaceName_local;
  string *blockName_local;
  IOBlock *this_local;
  
  TopLevelObject::TopLevelObject(&this->super_TopLevelObject);
  (this->super_TopLevelObject)._vptr_TopLevelObject = (_func_int **)&PTR__IOBlock_0166e6a0;
  std::__cxx11::string::string((string *)&this->m_blockName,(string *)blockName);
  std::__cxx11::string::string((string *)&this->m_interfaceName,(string *)interfaceName);
  std::
  vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
  ::vector(&this->m_members,members);
  return;
}

Assistant:

IOBlock (const std::string& blockName, const std::string& interfaceName, const std::vector<Member>& members)
		: m_blockName		(blockName)
		, m_interfaceName	(interfaceName)
		, m_members			(members)
	{
	}